

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinDeserializer<std::__cxx11::list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
     ::deserialize_elems_noinsert<InputStream>(long *param_1,undefined8 param_2,undefined8 param_3)

{
  list<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *__range3;
  long *plVar1;
  
  plVar1 = param_1;
  while (plVar1 = (long *)*plVar1, plVar1 != param_1) {
    BuiltinDeserializer<std::tuple<char,int>,void>::deserialize_elems<InputStream,0ul,1ul>
              (plVar1 + 2,param_3);
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }